

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

int ly_path_data2schema_subexp
              (ly_ctx *ctx,lys_node *orig_parent,lys_module *cur_mod,lyxp_expr *exp,
              uint16_t *cur_exp,char **out,uint16_t *out_used)

{
  lyxp_token lVar1;
  bool bVar2;
  bool bVar3;
  ushort uVar4;
  int iVar5;
  byte *__s;
  char *pcVar6;
  lys_node *last;
  lys_module *plVar7;
  lys_module *plVar8;
  lys_node *plVar9;
  size_t sVar10;
  char *pcVar11;
  size_t sVar12;
  ushort **ppuVar13;
  ulong uVar14;
  long lVar15;
  byte *__s2;
  LY_VLOG_ELEM elem_type;
  LY_ERR no;
  lyxp_token lVar16;
  LY_ECODE ecode;
  ushort uVar17;
  char *pcVar18;
  short sVar19;
  uint uVar20;
  byte *pbVar21;
  short sVar22;
  bool bVar23;
  lys_module *local_68;
  lys_node *local_50;
  
  uVar4 = *cur_exp;
  lVar1 = exp->tokens[uVar4];
  if (lVar1 == LYXP_TOKEN_PAR1) {
    iVar5 = ly_path_data2schema_copy_token(ctx,exp,uVar4,out,out_used);
    if (iVar5 != 0) {
LAB_0010aacd:
      __s = (byte *)0x0;
LAB_0010aacf:
      free(__s);
      return -1;
    }
    *cur_exp = *cur_exp + 1;
    lVar16 = LYXP_TOKEN_PAR2;
  }
  else {
    lVar16 = LYXP_TOKEN_NONE;
    bVar3 = true;
    if (lVar1 == LYXP_TOKEN_OPERATOR_PATH) {
      bVar23 = orig_parent == (lys_node *)0x0;
      goto LAB_0010aaea;
    }
    bVar23 = true;
    if (lVar1 != LYXP_TOKEN_BRACK1) goto LAB_0010aaea;
    iVar5 = ly_path_data2schema_copy_token(ctx,exp,uVar4,out,out_used);
    if (iVar5 != 0) goto LAB_0010aacd;
    *cur_exp = *cur_exp + 1;
    lVar16 = LYXP_TOKEN_BRACK2;
  }
  bVar23 = false;
  bVar3 = false;
LAB_0010aaea:
  uVar4 = *cur_exp;
  if (uVar4 < exp->used) {
    bVar2 = false;
    local_68 = cur_mod;
    local_50 = orig_parent;
    do {
      lVar1 = exp->tokens[uVar4];
      switch(lVar1) {
      case LYXP_TOKEN_PAR1:
      case LYXP_TOKEN_BRACK1:
        iVar5 = ly_path_data2schema_subexp(ctx,local_50,local_68,exp,cur_exp,out,out_used);
        break;
      default:
        if (bVar3 || lVar1 != lVar16) {
          uVar14 = (ulong)((uint)uVar4 * 2);
          __s = (byte *)0x0;
          ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid token used (%.*s).",
                 (ulong)*(ushort *)((long)exp->tok_len + uVar14),
                 exp->expr + *(ushort *)((long)exp->expr_pos + uVar14));
        }
        else {
          iVar5 = ly_path_data2schema_copy_token(ctx,exp,uVar4,out,out_used);
          __s = (byte *)0x0;
          if (iVar5 == 0) {
            return 0;
          }
        }
        goto LAB_0010aacf;
      case LYXP_TOKEN_DOT:
      case LYXP_TOKEN_DDOT:
      case LYXP_TOKEN_NAMETEST:
        if (bVar2) {
          iVar5 = ly_path_data2schema_copy_token(ctx,exp,uVar4,out,out_used);
          bVar2 = true;
          break;
        }
        uVar14 = (ulong)((uint)uVar4 * 2);
        __s = (byte *)strndup(exp->expr + *(ushort *)((long)exp->expr_pos + uVar14),
                              (ulong)*(ushort *)((long)exp->tok_len + uVar14));
        if (__s == (byte *)0x0) {
          pcVar6 = "Memory allocation failed (%s()).";
          pcVar18 = "ly_path_data2schema_subexp";
          no = LY_EMEM;
LAB_0010b05a:
          __s = (byte *)0x0;
          ly_log(ctx,LY_LLERR,no,pcVar6,pcVar18);
          goto LAB_0010aacf;
        }
        pcVar6 = strchr((char *)__s,0x3a);
        if (pcVar6 == (char *)0x0) {
          pbVar21 = (byte *)0x0;
        }
        else {
          *pcVar6 = '\0';
          pbVar21 = (byte *)(pcVar6 + 1);
        }
        if (bVar23) {
          if (pbVar21 == (byte *)0x0) {
            ecode = LYE_PATH_MISSMOD;
            elem_type = LY_VLOG_NONE;
            __s2 = (byte *)0x0;
LAB_0010afce:
            ly_vlog(ctx,ecode,elem_type,__s2);
            goto LAB_0010aacf;
          }
          local_68 = ly_ctx_get_module(ctx,(char *)__s,(char *)0x0,0);
          if (local_68 == (lys_module *)0x0) {
            ly_vlog(ctx,LYE_PATH_INMOD,LY_VLOG_STR,__s);
            goto LAB_0010aacf;
          }
        }
        __s2 = __s;
        if (pbVar21 != (byte *)0x0) {
          __s2 = pbVar21;
        }
        if ((*__s2 | 4) == 0x2e) {
          free(__s);
          if (bVar3) {
            iVar5 = ly_path_data2schema_copy_token(ctx,exp,*cur_exp,out,out_used);
            bVar2 = true;
            bVar23 = false;
            break;
          }
          pcVar6 = "Invalid path used (%s in a subexpression).";
          no = LY_EINVAL;
          pcVar18 = (char *)0x0;
          goto LAB_0010b05a;
        }
        last = (lys_node *)0x0;
        do {
          while( true ) {
            do {
              last = lys_getnext(last,local_50,local_68,0x100);
              if (last == (lys_node *)0x0) {
                ecode = LYE_PATH_INNODE;
                elem_type = LY_VLOG_STR;
                goto LAB_0010afce;
              }
              iVar5 = strcmp(last->name,(char *)__s2);
            } while (iVar5 != 0);
            plVar7 = lys_node_module(last);
            if (pbVar21 == (byte *)0x0) break;
            iVar5 = strcmp(plVar7->name,(char *)__s);
            if (iVar5 == 0) goto LAB_0010ad06;
          }
          plVar8 = lys_node_module(local_50);
        } while (plVar7 != plVar8);
LAB_0010ad06:
        if (last == local_50) {
          sVar22 = 0;
        }
        else {
          sVar22 = 0;
          plVar9 = last;
          do {
            plVar9 = lys_parent(plVar9);
            if ((plVar9 == (lys_node *)0x0) || (plVar9->nodetype != LYS_USES)) {
              sVar22 = sVar22 + 1;
            }
          } while (plVar9 != local_50);
        }
        if (sVar22 != 0) {
          lVar15 = 0;
          pcVar6 = "";
          do {
            sVar22 = sVar22 + -1;
            plVar9 = last;
            for (sVar19 = sVar22; sVar19 != 0;
                sVar19 = sVar19 - (ushort)(plVar9->nodetype != LYS_USES)) {
              plVar9 = lys_parent(plVar9);
              if (plVar9 == (lys_node *)0x0) {
                __assert_fail("node2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/common.c"
                              ,0x43b,
                              "int ly_path_data2schema_subexp(const struct ly_ctx *, const struct lys_node *, const struct lys_module *, struct lyxp_expr *, uint16_t *, char **, uint16_t *)"
                             );
              }
            }
            plVar7 = lys_node_module(plVar9);
            if (plVar7 == local_68 && local_50 != (lys_node *)0x0) {
              sVar10 = strlen(plVar9->name);
              uVar20 = (int)lVar15 + (int)sVar10;
              sVar19 = (short)uVar20;
              pcVar18 = *out;
              pcVar11 = (char *)realloc(pcVar18,((ulong)uVar20 & 0xffff) + (ulong)*out_used);
              if (pcVar11 == (char *)0x0) {
                free(pcVar18);
                *out = (char *)0x0;
                goto LAB_0010b0df;
              }
              *out = pcVar11;
              sprintf(pcVar11 + ((ulong)*out_used - 1),"%s%s",pcVar6,plVar9->name);
            }
            else {
              plVar7 = lys_node_module(plVar9);
              sVar10 = strlen(plVar7->name);
              sVar12 = strlen(plVar9->name);
              uVar14 = lVar15 + sVar10 + sVar12 + 1;
              pcVar18 = *out;
              pcVar11 = (char *)realloc(pcVar18,(uVar14 & 0xffff) + (ulong)*out_used);
              if (pcVar11 == (char *)0x0) {
                free(pcVar18);
                *out = (char *)0x0;
                goto LAB_0010b0df;
              }
              *out = pcVar11;
              uVar4 = *out_used;
              plVar7 = lys_node_module(plVar9);
              sprintf(pcVar11 + ((ulong)uVar4 - 1),"%s%s:%s",pcVar6,plVar7->name,plVar9->name);
              sVar19 = (short)uVar14;
            }
            *out_used = sVar19 + *out_used;
            lVar15 = 1;
            pcVar6 = "/";
          } while (sVar22 != 0);
        }
        ppuVar13 = __ctype_b_loc();
        sVar22 = 1;
        uVar4 = 0;
        do {
          uVar17 = uVar4;
          sVar22 = sVar22 + -1;
          uVar4 = uVar17 + 1;
        } while ((*(byte *)((long)*ppuVar13 +
                           (long)exp->expr[(ulong)((uint)*(ushort *)
                                                          ((long)exp->expr_pos +
                                                          (ulong)((uint)*cur_exp * 2)) +
                                                  (uint)uVar17) +
                                           (ulong)*(ushort *)
                                                   ((long)exp->tok_len + (ulong)((uint)*cur_exp * 2)
                                                   )] * 2 + 1) & 0x20) != 0);
        if (sVar22 != 0) {
          pcVar6 = (char *)ly_realloc(*out,(ulong)((uint)*out_used + (uint)uVar17));
          *out = pcVar6;
          if (pcVar6 == (char *)0x0) {
LAB_0010b0df:
            ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "ly_path_data2schema_subexp");
            goto LAB_0010aacf;
          }
          sprintf(pcVar6 + ((ulong)*out_used - 1),"%*s",(ulong)(uint)uVar17," ");
          *out_used = *out_used - sVar22;
        }
        free(__s);
        bVar23 = false;
        bVar2 = false;
        local_50 = last;
        goto LAB_0010ab72;
      case LYXP_TOKEN_COMMA:
      case LYXP_TOKEN_OPERATOR_LOG:
      case LYXP_TOKEN_OPERATOR_COMP:
      case LYXP_TOKEN_OPERATOR_MATH:
      case LYXP_TOKEN_OPERATOR_UNI:
        bVar2 = false;
        bVar23 = true;
        local_50 = orig_parent;
      case LYXP_TOKEN_OPERATOR_PATH:
        if ((lVar1 == LYXP_TOKEN_OPERATOR_PATH) && (exp->tok_len[uVar4] == 2)) {
          bVar2 = true;
        }
      case LYXP_TOKEN_NODETYPE:
      case LYXP_TOKEN_FUNCNAME:
      case LYXP_TOKEN_LITERAL:
      case LYXP_TOKEN_NUMBER:
        iVar5 = ly_path_data2schema_copy_token(ctx,exp,uVar4,out,out_used);
      }
      if (iVar5 != 0) goto LAB_0010aacd;
LAB_0010ab72:
      uVar4 = *cur_exp + 1;
      *cur_exp = uVar4;
    } while (uVar4 < exp->used);
  }
  if (!bVar3) {
    ly_vlog(ctx,LYE_XPATH_EOF,LY_VLOG_NONE,(void *)0x0);
    return -1;
  }
  return 0;
}

Assistant:

static int
ly_path_data2schema_subexp(const struct ly_ctx *ctx, const struct lys_node *orig_parent, const struct lys_module *cur_mod,
                           struct lyxp_expr *exp, uint16_t *cur_exp, char **out, uint16_t *out_used)
{
    uint16_t j, k, len, slash;
    char *str = NULL, *col;
    const struct lys_node *node, *node2, *parent;
    enum lyxp_token end_token = 0;
    int first, path_lost;

    switch (exp->tokens[*cur_exp]) {
    case LYXP_TOKEN_BRACK1:
        end_token = LYXP_TOKEN_BRACK2;

        if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
            goto error;
        }
        ++(*cur_exp);
        first = 0;
        break;
    case LYXP_TOKEN_PAR1:
        end_token = LYXP_TOKEN_PAR2;

        if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
            goto error;
        }
        ++(*cur_exp);
        first = 0;
        break;
    case LYXP_TOKEN_OPERATOR_PATH:
        first = (orig_parent) ? 0 : 1;
        break;
    default:
        first = 1;
        break;
    }

    path_lost = 0;
    parent = orig_parent;
    while (*cur_exp < exp->used) {
        switch (exp->tokens[*cur_exp]) {
        case LYXP_TOKEN_DOT:
        case LYXP_TOKEN_DDOT:
        case LYXP_TOKEN_NAMETEST:
            if (path_lost) {
                /* we do not know anything anymore, just copy it */
                if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
                    goto error;
                }
                break;
            }

            str = strndup(exp->expr + exp->expr_pos[*cur_exp], exp->tok_len[*cur_exp]);
            LY_CHECK_ERR_GOTO(!str, LOGMEM(ctx), error);

            col = strchr(str, ':');
            if (col) {
                *col = '\0';
                ++col;
            }

            /* first node */
            if (first) {
                if (!col) {
                    LOGVAL(ctx, LYE_PATH_MISSMOD, LY_VLOG_NONE, NULL);
                    goto error;
                }

                cur_mod = ly_ctx_get_module(ctx, str, NULL, 0);
                if (!cur_mod) {
                    LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
                    goto error;
                }

                first = 0;
            }

            if (((col ? col[0] : str[0]) == '.') || ((col ? col[0] : str[0]) == '*')) {
                free(str);
                str = NULL;

                if (end_token) {
                    LOGERR(ctx, LY_EINVAL, "Invalid path used (%s in a subexpression).", str);
                    goto error;
                }

                /* we can no longer evaluate the path, so just copy the rest */
                path_lost = 1;
                if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
                    goto error;
                }
                break;
            }

            /* create schema path for this data node */
            node = NULL;
            while ((node = lys_getnext(node, parent, cur_mod, LYS_GETNEXT_NOSTATECHECK))) {
                if (strcmp(node->name, col ? col : str)) {
                    continue;
                }

                if (col && strcmp(lys_node_module(node)->name, str)) {
                    continue;
                }
                if (!col && (lys_node_module(node) != lys_node_module(parent))) {
                    continue;
                }

                /* determine how deep the node actually is, we must generate the path from the highest parent */
                j = 0;
                node2 = node;
                while (node2 != parent) {
                    node2 = lys_parent(node2);
                    if (!node2 || (node2->nodetype != LYS_USES)) {
                        ++j;
                    }
                }

                /* first node, do not print '/' */
                slash = 0;
                while (j) {
                    k = j - 1;
                    node2 = node;
                    while (k) {
                        node2 = lys_parent(node2);
                        assert(node2);
                        if (node2->nodetype != LYS_USES) {
                            --k;
                        }
                    }

                    if ((lys_node_module(node2) != cur_mod) || !parent) {
                        /* module name and node name */
                        len = slash + strlen(lys_node_module(node2)->name) + 1 + strlen(node2->name);
                        *out = ly_realloc(*out, *out_used + len);
                        LY_CHECK_ERR_GOTO(!(*out), LOGMEM(ctx), error);
                        sprintf(*out + *out_used - 1, "%s%s:%s", slash ? "/" : "", lys_node_module(node2)->name, node2->name);
                        *out_used += len;
                    } else {
                        /* only node name */
                        len = slash + strlen(node2->name);
                        *out = ly_realloc(*out, *out_used + len);
                        LY_CHECK_ERR_GOTO(!(*out), LOGMEM(ctx), error);
                        sprintf(*out + *out_used - 1, "%s%s", slash ? "/" : "", node2->name);
                        *out_used += len;
                    }

                    slash = 1;
                    --j;
                }

                break;
            }
            if (!node) {
                LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, col ? col : str);
                goto error;
            }

            /* copy any whitespaces */
            for (len = 0; isspace(exp->expr[exp->expr_pos[*cur_exp] + exp->tok_len[*cur_exp] + len]); ++len);
            if (len) {
                *out = ly_realloc(*out, *out_used + len);
                LY_CHECK_ERR_GOTO(!(*out), LOGMEM(ctx), error);
                sprintf(*out + *out_used - 1, "%*s", len, " ");
                *out_used += len;
            }

            /* next iteration */
            free(str);
            str = NULL;
            parent = node;
            break;
        case LYXP_TOKEN_COMMA:
        case LYXP_TOKEN_OPERATOR_LOG:
        case LYXP_TOKEN_OPERATOR_COMP:
        case LYXP_TOKEN_OPERATOR_MATH:
        case LYXP_TOKEN_OPERATOR_UNI:
            /* reset the processing */
            first = 1;
            path_lost = 0;
            parent = orig_parent;

            /* fallthrough */
        case LYXP_TOKEN_OPERATOR_PATH:
            if ((exp->tokens[*cur_exp] == LYXP_TOKEN_OPERATOR_PATH) && (exp->tok_len[*cur_exp] == 2)) {
                /* we can no longer evaluate the path further */
                path_lost = 1;
            }
            /* fallthrough */
        case LYXP_TOKEN_NODETYPE:
        case LYXP_TOKEN_FUNCNAME:
        case LYXP_TOKEN_LITERAL:
        case LYXP_TOKEN_NUMBER:
            /* just copy it */
            if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
                goto error;
            }
            break;
        case LYXP_TOKEN_BRACK1:
        case LYXP_TOKEN_PAR1:
            if (ly_path_data2schema_subexp(ctx, parent, cur_mod, exp, cur_exp, out, out_used)) {
                goto error;
            }
            break;
        default:
            if (end_token && (exp->tokens[*cur_exp] == end_token)) {
                /* we are done (with this subexpression) */
                if (ly_path_data2schema_copy_token(ctx, exp, *cur_exp, out, out_used)) {
                    goto error;
                }

                return 0;
            }
            LOGERR(ctx, LY_EINVAL, "Invalid token used (%.*s).", exp->tok_len[*cur_exp], exp->expr + exp->expr_pos[*cur_exp]);
            goto error;
        }

        ++(*cur_exp);
    }

    if (end_token) {
        LOGVAL(ctx, LYE_XPATH_EOF, LY_VLOG_NONE, NULL);
        return -1;
    }

    return 0;

error:
    free(str);
    return -1;
}